

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dofhandler.cc
# Opt level: O0

void __thiscall lf::assemble::UniformFEDofHandler::initIndexArrays(UniformFEDofHandler *this)

{
  value_type vVar1;
  Entity *pEVar2;
  bool bVar3;
  RefElType RVar4;
  RefElType RVar5;
  glb_idx_t gVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  size_type sVar10;
  uint uVar11;
  element_type *peVar12;
  reference pvVar13;
  reference pvVar14;
  undefined4 extraout_var;
  reference pvVar15;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference ppEVar16;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  reference ppEVar17;
  reference peVar18;
  ulong uVar19;
  uint local_b00;
  allocator<char> local_af9;
  uint j_6;
  allocator<char> local_ad1;
  string local_ad0;
  allocator<char> local_aa9;
  string local_aa8;
  string local_a88;
  allocator<char> local_a61;
  string local_a60;
  allocator<char> local_a39;
  string local_a38;
  stringstream local_a18 [8];
  stringstream ss_3;
  ostream local_a08 [380];
  RefEl local_88c;
  RefEl local_88b;
  RefEl local_88a;
  RefEl local_889;
  size_type local_888;
  glb_idx_t local_884;
  size_type num_int_dofs_cell;
  int j_5;
  int j_4;
  glb_idx_t edge_int_dof_offset;
  glb_idx_t edge_idx_1;
  int ed_sub_idx;
  undefined1 auStack_868 [4];
  size_type no_edges_cell;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> edges;
  span<const_lf::mesh::Orientation,_18446744073709551615UL> edge_orientations;
  uint local_840;
  uint j_3;
  glb_idx_t vt_dof_offset;
  glb_idx_t vt_idx;
  Entity *vertex;
  iterator __end3_1;
  iterator __begin3_1;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range3_1;
  glb_idx_t cell_dof_offset;
  allocator<char> local_7d9;
  string local_7d8;
  allocator<char> local_7b1;
  string local_7b0;
  string local_790;
  allocator<char> local_769;
  string local_768;
  allocator<char> local_741;
  string local_740;
  stringstream local_720 [8];
  stringstream ss_2;
  ostream local_710 [376];
  value_type local_598;
  Entity *cell_p;
  int local_588;
  glb_idx_t cell_idx;
  size_type num_ext_dof_edge;
  size_type no_int_dof_edge;
  size_type max_num_dof_cells;
  size_type no_cells;
  uint j_2;
  uint j_1;
  glb_idx_t ep_dof_offset;
  glb_idx_t ep_idx;
  Entity *endpoint;
  iterator __end3;
  iterator __begin3;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range3;
  glb_idx_t edge_dof_offset;
  allocator<char> local_509;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  string local_4c0;
  allocator<char> local_499;
  string local_498;
  allocator<char> local_471;
  string local_470;
  stringstream local_450 [8];
  stringstream ss_1;
  ostream local_440 [376];
  value_type local_2c8;
  Entity *edge_p;
  glb_idx_t edge_idx;
  size_type num_dofs_edges;
  size_type no_edges;
  uint j;
  glb_idx_t node_dof_offset;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  string local_238;
  allocator<char> local_211;
  string local_210;
  allocator<char> local_1e9;
  string local_1e8;
  stringstream local_1b8 [8];
  stringstream ss;
  ostream local_1a8 [376];
  value_type local_30;
  Entity *node_p;
  uint local_20;
  glb_idx_t node_idx;
  size_type num_dofs_nodes;
  size_type no_nodes;
  gdof_idx_t dof_idx;
  UniformFEDofHandler *this_local;
  
  _num_dofs_nodes = 0;
  dof_idx = (gdof_idx_t)this;
  peVar12 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->mesh_);
  gVar6 = (*peVar12->_vptr_Mesh[3])(peVar12,2);
  node_idx = gVar6;
  pvVar13 = std::array<unsigned_int,_3UL>::operator[](&this->num_dofs_,(ulong)this->kNodeOrd);
  local_20 = gVar6 * *pvVar13;
  pvVar14 = std::array<std::vector<long,_std::allocator<long>_>,_3UL>::operator[]
                      (&this->dofs_,(ulong)this->kNodeOrd);
  std::vector<long,_std::allocator<long>_>::resize(pvVar14,(ulong)local_20);
  for (node_p._4_4_ = 0; node_p._4_4_ < node_idx; node_p._4_4_ = node_p._4_4_ + 1) {
    peVar12 = std::
              __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->mesh_);
    iVar7 = (*peVar12->_vptr_Mesh[6])(peVar12,2,(ulong)node_p._4_4_);
    local_30 = (value_type)CONCAT44(extraout_var,iVar7);
    peVar12 = std::
              __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->mesh_);
    uVar8 = (*peVar12->_vptr_Mesh[5])(peVar12,local_30);
    uVar9 = node_p._4_4_;
    if (uVar8 != node_p._4_4_) {
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::operator<<(local_1a8,"Node index mismatch");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,"mesh_->Index(*node_p) == node_idx",&local_1e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.cc"
                 ,&local_211);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_1e8,&local_210,0x9b,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator(&local_211);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::allocator<char>::~allocator(&local_1e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"false",&local_259);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_280,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.cc"
                 ,&local_281);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&node_dof_offset,"",(allocator<char> *)((long)&j + 3));
      lf::base::AssertionFailed(&local_258,&local_280,0x9b,(string *)&node_dof_offset);
      std::__cxx11::string::~string((string *)&node_dof_offset);
      std::allocator<char>::~allocator((allocator<char> *)((long)&j + 3));
      std::__cxx11::string::~string((string *)&local_280);
      std::allocator<char>::~allocator(&local_281);
      std::__cxx11::string::~string((string *)&local_258);
      std::allocator<char>::~allocator(&local_259);
      abort();
    }
    pvVar13 = std::array<unsigned_int,_3UL>::operator[](&this->num_dofs_,(ulong)this->kNodeOrd);
    no_edges = uVar9 * *pvVar13;
    for (num_dofs_edges = 0; vVar1 = _num_dofs_nodes, num_dofs_edges < this->num_loc_dof_point_;
        num_dofs_edges = num_dofs_edges + 1) {
      pvVar14 = std::array<std::vector<long,_std::allocator<long>_>,_3UL>::operator[]
                          (&this->dofs_,(ulong)this->kNodeOrd);
      uVar19 = (ulong)no_edges;
      no_edges = no_edges + 1;
      pvVar15 = std::vector<long,_std::allocator<long>_>::operator[](pvVar14,uVar19);
      *pvVar15 = vVar1;
      std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>::push_back
                (&this->dof_entities_,&local_30);
      _num_dofs_nodes = _num_dofs_nodes + 1;
    }
  }
  peVar12 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->mesh_);
  gVar6 = (*peVar12->_vptr_Mesh[3])(peVar12,1);
  edge_idx = gVar6;
  pvVar13 = std::array<unsigned_int,_3UL>::operator[](&this->num_dofs_,(ulong)this->kEdgeOrd);
  edge_p._4_4_ = gVar6 * *pvVar13;
  pvVar14 = std::array<std::vector<long,_std::allocator<long>_>,_3UL>::operator[]
                      (&this->dofs_,(ulong)this->kEdgeOrd);
  std::vector<long,_std::allocator<long>_>::resize(pvVar14,(ulong)edge_p._4_4_);
  for (edge_p._0_4_ = 0; (uint)edge_p < edge_idx; edge_p._0_4_ = (uint)edge_p + 1) {
    peVar12 = std::
              __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->mesh_);
    iVar7 = (*peVar12->_vptr_Mesh[6])(peVar12,1,(ulong)(uint)edge_p);
    local_2c8 = (value_type)CONCAT44(extraout_var_00,iVar7);
    peVar12 = std::
              __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->mesh_);
    uVar8 = (*peVar12->_vptr_Mesh[5])(peVar12,local_2c8);
    uVar9 = (uint)edge_p;
    if (uVar8 != (uint)edge_p) {
      std::__cxx11::stringstream::stringstream(local_450);
      std::operator<<(local_440,"Edge index mismatch");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_470,"mesh_->Index(*edge_p) == edge_idx",&local_471);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_498,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.cc"
                 ,&local_499);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_470,&local_498,0xb2,&local_4c0);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::__cxx11::string::~string((string *)&local_498);
      std::allocator<char>::~allocator(&local_499);
      std::__cxx11::string::~string((string *)&local_470);
      std::allocator<char>::~allocator(&local_471);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"false",&local_4e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_508,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.cc"
                 ,&local_509);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&edge_dof_offset,"",(allocator<char> *)((long)&__range3 + 7));
      lf::base::AssertionFailed(&local_4e0,&local_508,0xb2,(string *)&edge_dof_offset);
      std::__cxx11::string::~string((string *)&edge_dof_offset);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
      std::__cxx11::string::~string((string *)&local_508);
      std::allocator<char>::~allocator(&local_509);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::allocator<char>::~allocator(&local_4e1);
      abort();
    }
    pvVar13 = std::array<unsigned_int,_3UL>::operator[](&this->num_dofs_,(ulong)this->kEdgeOrd);
    __range3._0_4_ = uVar9 * *pvVar13;
    iVar7 = (*local_2c8->_vptr_Entity[1])(local_2c8,1);
    __begin3._M_current = (Entity **)CONCAT44(extraout_var_01,iVar7);
    __end3 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                       ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3);
    endpoint = (Entity *)
               std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                         ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3);
    while (bVar3 = __gnu_cxx::
                   operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                             (&__end3,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                       *)&endpoint), ((bVar3 ^ 0xffU) & 1) != 0) {
      ppEVar16 = __gnu_cxx::
                 __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                 ::operator*(&__end3);
      _ep_dof_offset = *ppEVar16;
      peVar12 = std::
                __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->mesh_);
      uVar9 = (*peVar12->_vptr_Mesh[5])(peVar12,_ep_dof_offset);
      j_1 = uVar9;
      pvVar13 = std::array<unsigned_int,_3UL>::operator[](&this->num_dofs_,(ulong)this->kNodeOrd);
      j_2 = uVar9 * *pvVar13;
      for (no_cells = 0; sVar10 = no_cells,
          pvVar13 = std::array<unsigned_int,_3UL>::operator[]
                              (&this->num_dofs_,(ulong)this->kNodeOrd), sVar10 < *pvVar13;
          no_cells = no_cells + 1) {
        pvVar14 = std::array<std::vector<long,_std::allocator<long>_>,_3UL>::operator[]
                            (&this->dofs_,(ulong)this->kNodeOrd);
        uVar19 = (ulong)j_2;
        j_2 = j_2 + 1;
        pvVar15 = std::vector<long,_std::allocator<long>_>::operator[](pvVar14,uVar19);
        vVar1 = *pvVar15;
        pvVar14 = std::array<std::vector<long,_std::allocator<long>_>,_3UL>::operator[]
                            (&this->dofs_,(ulong)this->kEdgeOrd);
        uVar19 = (ulong)(uint)__range3;
        __range3._0_4_ = (uint)__range3 + 1;
        pvVar15 = std::vector<long,_std::allocator<long>_>::operator[](pvVar14,uVar19);
        *pvVar15 = vVar1;
      }
      __gnu_cxx::
      __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
      ::operator++(&__end3);
    }
    for (max_num_dof_cells = 0; vVar1 = _num_dofs_nodes,
        max_num_dof_cells < this->num_loc_dof_segment_; max_num_dof_cells = max_num_dof_cells + 1) {
      pvVar14 = std::array<std::vector<long,_std::allocator<long>_>,_3UL>::operator[]
                          (&this->dofs_,(ulong)this->kEdgeOrd);
      uVar19 = (ulong)(uint)__range3;
      __range3._0_4_ = (uint)__range3 + 1;
      pvVar15 = std::vector<long,_std::allocator<long>_>::operator[](pvVar14,uVar19);
      *pvVar15 = vVar1;
      std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>::push_back
                (&this->dof_entities_,&local_2c8);
      _num_dofs_nodes = _num_dofs_nodes + 1;
    }
  }
  peVar12 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->mesh_);
  sVar10 = (*peVar12->_vptr_Mesh[3])(peVar12,0);
  no_int_dof_edge = sVar10;
  pvVar13 = std::array<unsigned_int,_3UL>::operator[](&this->num_dofs_,(ulong)this->kCellOrd);
  num_ext_dof_edge = sVar10 * *pvVar13;
  pvVar14 = std::array<std::vector<long,_std::allocator<long>_>,_3UL>::operator[]
                      (&this->dofs_,(ulong)this->kCellOrd);
  std::vector<long,_std::allocator<long>_>::resize(pvVar14,(ulong)num_ext_dof_edge);
  cell_idx = this->num_loc_dof_segment_;
  pvVar13 = std::array<unsigned_int,_3UL>::operator[](&this->num_dofs_,(ulong)this->kEdgeOrd);
  local_588 = *pvVar13 - cell_idx;
  cell_p._4_4_ = 0;
  while( true ) {
    if (no_int_dof_edge <= cell_p._4_4_) {
      this->num_dof_ = (size_type)_num_dofs_nodes;
      return;
    }
    peVar12 = std::
              __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->mesh_);
    iVar7 = (*peVar12->_vptr_Mesh[6])(peVar12,0,(ulong)cell_p._4_4_);
    uVar9 = cell_p._4_4_;
    local_598 = (value_type)CONCAT44(extraout_var_02,iVar7);
    peVar12 = std::
              __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->mesh_);
    uVar11 = (*peVar12->_vptr_Mesh[5])(peVar12,local_598);
    uVar8 = cell_p._4_4_;
    if (uVar9 != uVar11) break;
    pvVar13 = std::array<unsigned_int,_3UL>::operator[](&this->num_dofs_,(ulong)this->kCellOrd);
    __range3_1._0_4_ = uVar8 * *pvVar13;
    iVar7 = (*local_598->_vptr_Entity[1])(local_598,2);
    __begin3_1._M_current = (Entity **)CONCAT44(extraout_var_03,iVar7);
    __end3_1 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                         ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3_1
                         );
    vertex = (Entity *)
             std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                       ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3_1);
    while (bVar3 = __gnu_cxx::
                   operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                             (&__end3_1,
                              (__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                               *)&vertex), ((bVar3 ^ 0xffU) & 1) != 0) {
      ppEVar16 = __gnu_cxx::
                 __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                 ::operator*(&__end3_1);
      pEVar2 = *ppEVar16;
      peVar12 = std::
                __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->mesh_);
      iVar7 = (*peVar12->_vptr_Mesh[5])(peVar12,pEVar2);
      pvVar13 = std::array<unsigned_int,_3UL>::operator[](&this->num_dofs_,(ulong)this->kNodeOrd);
      local_840 = iVar7 * *pvVar13;
      for (edge_orientations._M_extent._M_extent_value._4_4_ = 0;
          pvVar13 = std::array<unsigned_int,_3UL>::operator[]
                              (&this->num_dofs_,(ulong)this->kNodeOrd),
          edge_orientations._M_extent._M_extent_value._4_4_ < *pvVar13;
          edge_orientations._M_extent._M_extent_value._4_4_ =
               edge_orientations._M_extent._M_extent_value._4_4_ + 1) {
        pvVar14 = std::array<std::vector<long,_std::allocator<long>_>,_3UL>::operator[]
                            (&this->dofs_,(ulong)this->kNodeOrd);
        pvVar15 = std::vector<long,_std::allocator<long>_>::operator[](pvVar14,(ulong)local_840);
        vVar1 = *pvVar15;
        pvVar14 = std::array<std::vector<long,_std::allocator<long>_>,_3UL>::operator[]
                            (&this->dofs_,(ulong)this->kCellOrd);
        uVar19 = (ulong)(uint)__range3_1;
        __range3_1._0_4_ = (uint)__range3_1 + 1;
        pvVar15 = std::vector<long,_std::allocator<long>_>::operator[](pvVar14,uVar19);
        *pvVar15 = vVar1;
        local_840 = local_840 + 1;
      }
      __gnu_cxx::
      __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
      ::operator++(&__end3_1);
    }
    iVar7 = (*local_598->_vptr_Entity[2])();
    edges._M_extent._M_extent_value = CONCAT44(extraout_var_04,iVar7);
    iVar7 = (*local_598->_vptr_Entity[1])(local_598,1);
    _auStack_868 = (pointer)CONCAT44(extraout_var_05,iVar7);
    iVar7 = (*local_598->_vptr_Entity[4])();
    edge_idx_1._3_1_ = (undefined1)iVar7;
    ed_sub_idx = lf::base::RefEl::NumSubEntities((RefEl *)((long)&edge_idx_1 + 3),1);
    for (edge_int_dof_offset = 0; edge_int_dof_offset < (uint)ed_sub_idx;
        edge_int_dof_offset = edge_int_dof_offset + 1) {
      peVar12 = std::
                __shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->mesh_);
      ppEVar17 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                           ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                            auStack_868,(long)(int)edge_int_dof_offset);
      iVar7 = (*peVar12->_vptr_Mesh[5])(peVar12,*ppEVar17);
      j_4 = iVar7;
      pvVar13 = std::array<unsigned_int,_3UL>::operator[](&this->num_dofs_,(ulong)this->kEdgeOrd);
      j_5 = iVar7 * *pvVar13 + local_588;
      if (((this->check_edge_orientation_ & 1U) == 0) ||
         (peVar18 = std::span<const_lf::mesh::Orientation,_18446744073709551615UL>::operator[]
                              ((span<const_lf::mesh::Orientation,_18446744073709551615UL> *)
                               &edges._M_extent,(long)(int)edge_int_dof_offset), gVar6 = cell_idx,
         *peVar18 == positive)) {
        for (num_int_dofs_cell = 0; num_int_dofs_cell < cell_idx;
            num_int_dofs_cell = num_int_dofs_cell + 1) {
          pvVar14 = std::array<std::vector<long,_std::allocator<long>_>,_3UL>::operator[]
                              (&this->dofs_,(ulong)this->kEdgeOrd);
          pvVar15 = std::vector<long,_std::allocator<long>_>::operator[]
                              (pvVar14,(ulong)(j_5 + num_int_dofs_cell));
          vVar1 = *pvVar15;
          pvVar14 = std::array<std::vector<long,_std::allocator<long>_>,_3UL>::operator[]
                              (&this->dofs_,(ulong)this->kCellOrd);
          uVar19 = (ulong)(uint)__range3_1;
          __range3_1._0_4_ = (uint)__range3_1 + 1;
          pvVar15 = std::vector<long,_std::allocator<long>_>::operator[](pvVar14,uVar19);
          *pvVar15 = vVar1;
        }
      }
      else {
        while (local_884 = gVar6 - 1, -1 < (int)local_884) {
          pvVar14 = std::array<std::vector<long,_std::allocator<long>_>,_3UL>::operator[]
                              (&this->dofs_,(ulong)this->kEdgeOrd);
          pvVar15 = std::vector<long,_std::allocator<long>_>::operator[]
                              (pvVar14,(ulong)(j_5 + local_884));
          vVar1 = *pvVar15;
          pvVar14 = std::array<std::vector<long,_std::allocator<long>_>,_3UL>::operator[]
                              (&this->dofs_,(ulong)this->kCellOrd);
          uVar19 = (ulong)(uint)__range3_1;
          __range3_1._0_4_ = (uint)__range3_1 + 1;
          pvVar15 = std::vector<long,_std::allocator<long>_>::operator[](pvVar14,uVar19);
          *pvVar15 = vVar1;
          gVar6 = local_884;
        }
      }
    }
    iVar7 = (*local_598->_vptr_Entity[4])();
    local_889.type_ = (RefElType)iVar7;
    RVar4 = lf::base::RefEl::operator_cast_to_RefElType(&local_889);
    local_88a = lf::base::RefEl::kTria();
    RVar5 = lf::base::RefEl::operator_cast_to_RefElType(&local_88a);
    if (RVar4 == RVar5) {
      local_888 = this->num_loc_dof_tria_;
    }
    else {
      iVar7 = (*local_598->_vptr_Entity[4])();
      local_88b.type_ = (RefElType)iVar7;
      RVar4 = lf::base::RefEl::operator_cast_to_RefElType(&local_88b);
      local_88c = lf::base::RefEl::kQuad();
      RVar5 = lf::base::RefEl::operator_cast_to_RefElType(&local_88c);
      if (RVar4 != RVar5) {
        std::__cxx11::stringstream::stringstream(local_a18);
        std::operator<<(local_a08,"Illegal cell type; only triangles and quads are supported");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a38,"false",&local_a39);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a60,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.cc"
                   ,&local_a61);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_a38,&local_a60,0x110,&local_a88);
        std::__cxx11::string::~string((string *)&local_a88);
        std::__cxx11::string::~string((string *)&local_a60);
        std::allocator<char>::~allocator(&local_a61);
        std::__cxx11::string::~string((string *)&local_a38);
        std::allocator<char>::~allocator(&local_a39);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_aa8,"false",&local_aa9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_ad0,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.cc"
                   ,&local_ad1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&j_6,"",&local_af9);
        lf::base::AssertionFailed(&local_aa8,&local_ad0,0x110,(string *)&j_6);
        std::__cxx11::string::~string((string *)&j_6);
        std::allocator<char>::~allocator(&local_af9);
        std::__cxx11::string::~string((string *)&local_ad0);
        std::allocator<char>::~allocator(&local_ad1);
        std::__cxx11::string::~string((string *)&local_aa8);
        std::allocator<char>::~allocator(&local_aa9);
        abort();
      }
      local_888 = this->num_loc_dof_quad_;
    }
    for (local_b00 = 0; vVar1 = _num_dofs_nodes, local_b00 < local_888; local_b00 = local_b00 + 1) {
      pvVar14 = std::array<std::vector<long,_std::allocator<long>_>,_3UL>::operator[]
                          (&this->dofs_,(ulong)this->kCellOrd);
      uVar19 = (ulong)(uint)__range3_1;
      __range3_1._0_4_ = (uint)__range3_1 + 1;
      pvVar15 = std::vector<long,_std::allocator<long>_>::operator[](pvVar14,uVar19);
      *pvVar15 = vVar1;
      std::vector<const_lf::mesh::Entity_*,_std::allocator<const_lf::mesh::Entity_*>_>::push_back
                (&this->dof_entities_,&local_598);
      _num_dofs_nodes = _num_dofs_nodes + 1;
    }
    cell_p._4_4_ = cell_p._4_4_ + 1;
  }
  std::__cxx11::stringstream::stringstream(local_720);
  std::operator<<(local_710,"cell index mismatch");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_740,"cell_idx == mesh_->Index(*cell_p)",&local_741);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_768,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.cc"
             ,&local_769);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_740,&local_768,0xd8,&local_790);
  std::__cxx11::string::~string((string *)&local_790);
  std::__cxx11::string::~string((string *)&local_768);
  std::allocator<char>::~allocator(&local_769);
  std::__cxx11::string::~string((string *)&local_740);
  std::allocator<char>::~allocator(&local_741);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7b0,"false",&local_7b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7d8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/dofhandler.cc"
             ,&local_7d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cell_dof_offset,"",(allocator<char> *)((long)&__range3_1 + 7));
  lf::base::AssertionFailed(&local_7b0,&local_7d8,0xd8,(string *)&cell_dof_offset);
  std::__cxx11::string::~string((string *)&cell_dof_offset);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range3_1 + 7));
  std::__cxx11::string::~string((string *)&local_7d8);
  std::allocator<char>::~allocator(&local_7d9);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::allocator<char>::~allocator(&local_7b1);
  abort();
}

Assistant:

void UniformFEDofHandler::initIndexArrays() {
  // This method assumes a proper initialization
  // of the data in no_loc_dof_* and num_dofs_, num_dof_tria, num_dofs_quad_
  gdof_idx_t dof_idx = 0;

  // Step I: Set indices for shape functions on nodes
  // Total number of degrees of freedom on nodes (entities of co-dim = 2)
  const size_type no_nodes = mesh_->NumEntities(2);
  const size_type num_dofs_nodes = no_nodes * num_dofs_[kNodeOrd];
  dofs_[kNodeOrd].resize(num_dofs_nodes);
  // Run through nodes in the order given by their numbering
  for (glb_idx_t node_idx = 0; node_idx < no_nodes; node_idx++) {
    const mesh::Entity *node_p{mesh_->EntityByIndex(2, node_idx)};
    LF_ASSERT_MSG(mesh_->Index(*node_p) == node_idx, "Node index mismatch");
    // Beginning of section for concrete node in the dof index vector
    // for entities of co-dimension 2
    glb_idx_t node_dof_offset = node_idx * num_dofs_[kNodeOrd];
    for (unsigned j = 0; j < num_loc_dof_point_; j++) {
      dofs_[kNodeOrd][node_dof_offset++] = dof_idx;
      dof_entities_.push_back(node_p);  // Store entity for current dof
      dof_idx++;                        // Move on to next index
    }
  }

  // Step II: Set indices for shape functions on edges
  // Total number of degrees of freedom belonging to edges (entities of co-dim =
  // 1)
  const size_type no_edges = mesh_->NumEntities(1);
  const size_type num_dofs_edges = no_edges * num_dofs_[kEdgeOrd];
  dofs_[kEdgeOrd].resize(num_dofs_edges);
  // Visit all edges
  // Old implementation, see remarks above
  // for (const lf::mesh::Entity &edge : mesh_->Entities(1)) {
  for (glb_idx_t edge_idx = 0; edge_idx < no_edges; edge_idx++) {
    // Obtain pointer to edge entity
    const mesh::Entity *edge_p{mesh_->EntityByIndex(1, edge_idx)};
    LF_ASSERT_MSG(mesh_->Index(*edge_p) == edge_idx, "Edge index mismatch");
    // Beginning of section for concrete edge in the dof index vector
    // for entities of co-dimension 1
    glb_idx_t edge_dof_offset = edge_idx * num_dofs_[kEdgeOrd];

    // Obtain indices for basis functions sitting at endpoints
    for (const lf::mesh::Entity *endpoint : edge_p->SubEntities(1)) {
      const glb_idx_t ep_idx(mesh_->Index(*endpoint));
      glb_idx_t ep_dof_offset = ep_idx * num_dofs_[kNodeOrd];
      // Copy indices of shape functions from nodes to edge
      for (unsigned j = 0; j < num_dofs_[kNodeOrd]; j++) {
        dofs_[kEdgeOrd][edge_dof_offset++] = dofs_[kNodeOrd][ep_dof_offset++];
      }
    }
    // Set indices for interior edge degrees of freedom
    for (unsigned j = 0; j < num_loc_dof_segment_; j++) {
      dofs_[kEdgeOrd][edge_dof_offset++] = dof_idx;
      dof_entities_.push_back(edge_p);
      dof_idx++;
    }
  }

  // Step III: Set indices for shape functions on cells
  const size_type no_cells = mesh_->NumEntities(0);
  const size_type max_num_dof_cells = no_cells * num_dofs_[kCellOrd];
  dofs_[kCellOrd].resize(max_num_dof_cells);

  // Number of (non-)interior shape functins for edges
  const size_type no_int_dof_edge = num_loc_dof_segment_;
  const size_type num_ext_dof_edge = num_dofs_[kEdgeOrd] - no_int_dof_edge;

  // Visit all cells
  // Old implementation without strong link between cell
  // indices and ordering of global shape functions
  // for (const lf::mesh::Entity &cell : mesh_->Entities(0)) {
  for (glb_idx_t cell_idx = 0; cell_idx < no_cells; cell_idx++) {
    // Obtain pointer to current ell
    const mesh::Entity *cell_p{mesh_->EntityByIndex(0, cell_idx)};
    LF_ASSERT_MSG(cell_idx == mesh_->Index(*cell_p), "cell index mismatch");
    // Offset for cell dof indices in large dof index vector
    glb_idx_t cell_dof_offset = cell_idx * num_dofs_[kCellOrd];

    // Obtain indices for basis functions in vertices
    for (const lf::mesh::Entity *vertex : cell_p->SubEntities(2)) {
      const glb_idx_t vt_idx(mesh_->Index(*vertex));
      glb_idx_t vt_dof_offset = vt_idx * num_dofs_[kNodeOrd];
      // Copy indices of shape functions from nodes to cell
      for (unsigned j = 0; j < num_dofs_[kNodeOrd]; j++) {
        dofs_[kCellOrd][cell_dof_offset++] = dofs_[kNodeOrd][vt_dof_offset++];
      }
    }

    // Collect indices of interior shape functions of edges
    // Internal ordering may depend on the orientation of the edge, if
    // the check_edge_orientation_ flag is set
    const std::span<const lf::mesh::Orientation> edge_orientations =
        cell_p->RelativeOrientations();
    auto edges = cell_p->SubEntities(1);
    // Loop over edges
    const size_type no_edges_cell = cell_p->RefEl().NumSubEntities(1);
    for (int ed_sub_idx = 0; ed_sub_idx < no_edges_cell; ed_sub_idx++) {
      const glb_idx_t edge_idx = mesh_->Index(*edges[ed_sub_idx]);
      const glb_idx_t edge_int_dof_offset =
          edge_idx * num_dofs_[kEdgeOrd] + num_ext_dof_edge;
      // Copy indices of shape functions from edges to cell
      // The order, in which they are copied depends on the relative orientation
      // of the edge w.r.t. the cell, if the edge_orientation_flag is set
      if (!check_edge_orientation_ or
          (edge_orientations[ed_sub_idx] == lf::mesh::Orientation::positive)) {
        // Cell-internal and intrinsic orientation match, do not tinker with
        // the numbering of local shape functions
        for (int j = 0; j < no_int_dof_edge; j++) {
          dofs_[kCellOrd][cell_dof_offset++] =
              dofs_[kEdgeOrd][edge_int_dof_offset + j];
        }
      } else {
        // lf::mesh::Orientation::negative: Mismatch of orientations
        // reverse numbering of cell-internal d.o.f.s
        for (int j = static_cast<int>(no_int_dof_edge - 1); j >= 0; j--) {
          dofs_[kCellOrd][cell_dof_offset++] =
              dofs_[kEdgeOrd][edge_int_dof_offset + j];
        }
      }
    }

    // Set indices for interior cell degrees of freedom depending on the type of
    // cell. Here we add new degrees of freedom
    size_type num_int_dofs_cell;
    if (cell_p->RefEl() == lf::base::RefEl::kTria()) {
      num_int_dofs_cell = num_loc_dof_tria_;
    } else if (cell_p->RefEl() == lf::base::RefEl::kQuad()) {
      num_int_dofs_cell = num_loc_dof_quad_;
    } else {
      LF_ASSERT_MSG(
          false, "Illegal cell type; only triangles and quads are supported");
    }

    // enlist new interior cell-associated dofs
    for (unsigned j = 0; j < num_int_dofs_cell; j++) {
      dofs_[kCellOrd][cell_dof_offset++] = dof_idx;
      dof_entities_.push_back(cell_p);
      dof_idx++;
    }
  }
  // Finally store total number of shape functions on the mesh.
  num_dof_ = dof_idx;
}